

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_after_next_call_previous_controls_are_cleared_out_Test
::TestBody(SubjectSetRegisterTest_next_subscription_sync_after_next_call_previous_controls_are_cleared_out_Test
           *this)

{
  long lVar1;
  char *message;
  char *in_R9;
  AssertHelper local_1a8;
  AssertHelper local_1a0;
  AssertionResult gtest_ar;
  _Storage<bidfx_public_api::price::pixie::SubscriptionSync,_false> local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  SubjectSetRegister subject_register;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(&subject_register);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)&local_b8,(Subject *)SS_RFS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_b8,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)&local_d0,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_d0,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  bidfx_public_api::price::pixie::SubscriptionSync::GetSubjects();
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)
             &local_188._M_value);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)&subject_register);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)&subject_register);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)&local_e8,(Subject *)SS_RFS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_e8,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)&local_100,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_100,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100);
  local_1a0.data_._0_4_ = 2;
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  lVar1 = bidfx_public_api::price::pixie::SubscriptionSync::GetControls();
  local_1a8.data_ = *(AssertHelperData **)(lVar1 + 0x28);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"2",
             "subject_register.NextSubscriptionSync()->GetControls().size()",(int *)&local_1a0,
             (unsigned_long *)&local_1a8);
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)
             &local_188._M_value);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_188._M_value);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x330,message);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188._M_value);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_188._M_value);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_118,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_118,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  lVar1 = bidfx_public_api::price::pixie::SubscriptionSync::GetControls();
  lVar1 = *(long *)(lVar1 + 0x28);
  gtest_ar.success_ = lVar1 == 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)
             &local_188._M_value);
  if (lVar1 != 0) {
    testing::Message::Message((Message *)&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_188._M_value,(internal *)&gtest_ar,
               (AssertionResult *)"subject_register.NextSubscriptionSync()->GetControls().empty()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x333,(char *)local_188._0_8_);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    std::__cxx11::string::~string((string *)&local_188._M_value);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  SubjectSetRegister::~SubjectSetRegister(&subject_register);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_after_next_call_previous_controls_are_cleared_out)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_RFS_SUBJECT1, false);
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    subject_register.NextSubscriptionSync()->GetSubjects();

    subject_register.Unregister(SS_RFS_SUBJECT1);
    subject_register.Unregister(SS_RFQ_SUBJECT3);
    subject_register.Register(SS_RFS_SUBJECT1, true);
    subject_register.Register(SS_RFQ_SUBJECT3, false);

    EXPECT_EQ(2, subject_register.NextSubscriptionSync()->GetControls().size());

    subject_register.Register(SS_SUBJECT0, false);
    EXPECT_TRUE(subject_register.NextSubscriptionSync()->GetControls().empty());
}